

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

char * gl4cts::anon_unknown_0::GetInputC4
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  pointer puVar1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0xf0);
  puVar1 = (in_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = '\x01';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\x02';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\x03';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\x04';
  puVar1[0x21] = '\0';
  puVar1[0x22] = '\0';
  puVar1[0x23] = '\0';
  puVar1[0x24] = '\x05';
  puVar1[0x25] = '\0';
  puVar1[0x26] = '\0';
  puVar1[0x27] = '\0';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = '\0';
  puVar1[0x2b] = '\0';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = '\0';
  puVar1[0x31] = '\0';
  puVar1[0x32] = 0xc0;
  puVar1[0x33] = '@';
  puVar1[0x34] = '\0';
  puVar1[0x35] = '\0';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = '\0';
  puVar1[0x39] = '\0';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = '\0';
  puVar1[0x3f] = '\0';
  puVar1[0x40] = '\0';
  puVar1[0x41] = '\0';
  puVar1[0x42] = 0xe0;
  puVar1[0x43] = '@';
  puVar1[0x44] = '\0';
  puVar1[0x45] = '\0';
  puVar1[0x46] = '\0';
  puVar1[0x47] = 'A';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = '\0';
  puVar1[0x4b] = '\0';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  puVar1[0x50] = '\t';
  puVar1[0x51] = '\0';
  puVar1[0x52] = '\0';
  puVar1[0x53] = '\0';
  puVar1[0x54] = '\n';
  puVar1[0x55] = '\0';
  puVar1[0x56] = '\0';
  puVar1[0x57] = '\0';
  puVar1[0x58] = '\v';
  puVar1[0x59] = '\0';
  puVar1[0x5a] = '\0';
  puVar1[0x5b] = '\0';
  puVar1[0x5c] = '\0';
  puVar1[0x5d] = '\0';
  puVar1[0x5e] = '\0';
  puVar1[0x5f] = '\0';
  puVar1[0x60] = '\0';
  puVar1[0x61] = '\0';
  puVar1[0x62] = '@';
  puVar1[99] = 'A';
  puVar1[100] = '\0';
  puVar1[0x65] = '\0';
  puVar1[0x66] = 'P';
  puVar1[0x67] = 'A';
  puVar1[0x68] = '\0';
  puVar1[0x69] = '\0';
  puVar1[0x6a] = '\0';
  puVar1[0x6b] = '\0';
  puVar1[0x6c] = '\0';
  puVar1[0x6d] = '\0';
  puVar1[0x6e] = '\0';
  puVar1[0x6f] = '\0';
  puVar1[0x70] = '\x0e';
  puVar1[0x71] = '\0';
  puVar1[0x72] = '\0';
  puVar1[0x73] = '\0';
  puVar1[0x74] = '\x0f';
  puVar1[0x75] = '\0';
  puVar1[0x76] = '\0';
  puVar1[0x77] = '\0';
  puVar1[0x78] = '\x10';
  puVar1[0x79] = '\0';
  puVar1[0x7a] = '\0';
  puVar1[0x7b] = '\0';
  puVar1[0x7c] = '\0';
  puVar1[0x7d] = '\0';
  puVar1[0x7e] = '\0';
  puVar1[0x7f] = '\0';
  puVar1[0x80] = '\0';
  puVar1[0x81] = '\0';
  puVar1[0x82] = 0x88;
  puVar1[0x83] = 'A';
  puVar1[0x84] = '\0';
  puVar1[0x85] = '\0';
  puVar1[0x86] = '\0';
  puVar1[0x87] = '\0';
  puVar1[0x88] = '\0';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  puVar1[0x8c] = '\0';
  puVar1[0x8d] = '\0';
  puVar1[0x8e] = '\0';
  puVar1[0x8f] = '\0';
  puVar1[0x90] = '\x12';
  puVar1[0x91] = '\0';
  puVar1[0x92] = '\0';
  puVar1[0x93] = '\0';
  puVar1[0x94] = '\0';
  puVar1[0x95] = '\0';
  puVar1[0x96] = '\0';
  puVar1[0x97] = '\0';
  puVar1[0x98] = '\0';
  puVar1[0x99] = '\0';
  puVar1[0x9a] = '\0';
  puVar1[0x9b] = '\0';
  puVar1[0x9c] = '\0';
  puVar1[0x9d] = '\0';
  puVar1[0x9e] = '\0';
  puVar1[0x9f] = '\0';
  puVar1[0xa0] = '\x13';
  puVar1[0xa1] = '\0';
  puVar1[0xa2] = '\0';
  puVar1[0xa3] = '\0';
  puVar1[0xa4] = '\x14';
  puVar1[0xa5] = '\0';
  puVar1[0xa6] = '\0';
  puVar1[0xa7] = '\0';
  puVar1[0xa8] = '\0';
  puVar1[0xa9] = '\0';
  puVar1[0xaa] = '\0';
  puVar1[0xab] = '\0';
  puVar1[0xac] = '\0';
  puVar1[0xad] = '\0';
  puVar1[0xae] = '\0';
  puVar1[0xaf] = '\0';
  puVar1[0xb0] = '\x15';
  puVar1[0xb1] = '\0';
  puVar1[0xb2] = '\0';
  puVar1[0xb3] = '\0';
  puVar1[0xb4] = '\0';
  puVar1[0xb5] = '\0';
  puVar1[0xb6] = '\0';
  puVar1[0xb7] = '\0';
  puVar1[0xc0] = '\0';
  puVar1[0xc1] = '\0';
  puVar1[0xc2] = 0xb0;
  puVar1[0xc3] = 'A';
  puVar1[0xc4] = '\0';
  puVar1[0xc5] = '\0';
  puVar1[0xc6] = 0xb8;
  puVar1[199] = 'A';
  puVar1[200] = '\0';
  puVar1[0xc9] = '\0';
  puVar1[0xca] = '\0';
  puVar1[0xcb] = '\0';
  puVar1[0xcc] = '\0';
  puVar1[0xcd] = '\0';
  puVar1[0xce] = '\0';
  puVar1[0xcf] = '\0';
  puVar1[0xd0] = '\x18';
  puVar1[0xd1] = '\0';
  puVar1[0xd2] = '\0';
  puVar1[0xd3] = '\0';
  puVar1[0xd4] = '\x19';
  puVar1[0xd5] = '\0';
  puVar1[0xd6] = '\0';
  puVar1[0xd7] = '\0';
  puVar1[0xd8] = '\x1a';
  puVar1[0xd9] = '\0';
  puVar1[0xda] = '\0';
  puVar1[0xdb] = '\0';
  puVar1[0xdc] = '\0';
  puVar1[0xdd] = '\0';
  puVar1[0xde] = '\0';
  puVar1[0xdf] = '\0';
  puVar1[0xe0] = '\0';
  puVar1[0xe1] = '\0';
  puVar1[0xe2] = 0xd8;
  puVar1[0xe3] = 'A';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 1,0xf0);
  puVar1 = in_data[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = 'e';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = 'f';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = 'g';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = 'h';
  puVar1[0x21] = '\0';
  puVar1[0x22] = '\0';
  puVar1[0x23] = '\0';
  puVar1[0x24] = 'i';
  puVar1[0x25] = '\0';
  puVar1[0x26] = '\0';
  puVar1[0x27] = '\0';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = '\0';
  puVar1[0x2b] = '\0';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = '\0';
  puVar1[0x31] = '\0';
  puVar1[0x32] = 0xd4;
  puVar1[0x33] = 'B';
  puVar1[0x34] = '\0';
  puVar1[0x35] = '\0';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = '\0';
  puVar1[0x39] = '\0';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = '\0';
  puVar1[0x3f] = '\0';
  puVar1[0x40] = '\0';
  puVar1[0x41] = '\0';
  puVar1[0x42] = 0xd6;
  puVar1[0x43] = 'B';
  puVar1[0x44] = '\0';
  puVar1[0x45] = '\0';
  puVar1[0x46] = 0xd8;
  puVar1[0x47] = 'B';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = '\0';
  puVar1[0x4b] = '\0';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  puVar1[0x50] = 'm';
  puVar1[0x51] = '\0';
  puVar1[0x52] = '\0';
  puVar1[0x53] = '\0';
  puVar1[0x54] = 'n';
  puVar1[0x55] = '\0';
  puVar1[0x56] = '\0';
  puVar1[0x57] = '\0';
  puVar1[0x58] = 'o';
  puVar1[0x59] = '\0';
  puVar1[0x5a] = '\0';
  puVar1[0x5b] = '\0';
  puVar1[0x5c] = '\0';
  puVar1[0x5d] = '\0';
  puVar1[0x5e] = '\0';
  puVar1[0x5f] = '\0';
  puVar1[0x60] = '\0';
  puVar1[0x61] = '\0';
  puVar1[0x62] = 0xe0;
  puVar1[99] = 'B';
  puVar1[100] = '\0';
  puVar1[0x65] = '\0';
  puVar1[0x66] = 0xe2;
  puVar1[0x67] = 'B';
  puVar1[0x68] = '\0';
  puVar1[0x69] = '\0';
  puVar1[0x6a] = '\0';
  puVar1[0x6b] = '\0';
  puVar1[0x6c] = '\0';
  puVar1[0x6d] = '\0';
  puVar1[0x6e] = '\0';
  puVar1[0x6f] = '\0';
  puVar1[0x70] = 'r';
  puVar1[0x71] = '\0';
  puVar1[0x72] = '\0';
  puVar1[0x73] = '\0';
  puVar1[0x74] = 's';
  puVar1[0x75] = '\0';
  puVar1[0x76] = '\0';
  puVar1[0x77] = '\0';
  puVar1[0x78] = 't';
  puVar1[0x79] = '\0';
  puVar1[0x7a] = '\0';
  puVar1[0x7b] = '\0';
  puVar1[0x7c] = '\0';
  puVar1[0x7d] = '\0';
  puVar1[0x7e] = '\0';
  puVar1[0x7f] = '\0';
  puVar1[0x80] = '\0';
  puVar1[0x81] = '\0';
  puVar1[0x82] = 0xea;
  puVar1[0x83] = 'B';
  puVar1[0x84] = '\0';
  puVar1[0x85] = '\0';
  puVar1[0x86] = '\0';
  puVar1[0x87] = '\0';
  puVar1[0x88] = '\0';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  puVar1[0x8c] = '\0';
  puVar1[0x8d] = '\0';
  puVar1[0x8e] = '\0';
  puVar1[0x8f] = '\0';
  puVar1[0x90] = 'v';
  puVar1[0x91] = '\0';
  puVar1[0x92] = '\0';
  puVar1[0x93] = '\0';
  puVar1[0x94] = '\0';
  puVar1[0x95] = '\0';
  puVar1[0x96] = '\0';
  puVar1[0x97] = '\0';
  puVar1[0x98] = '\0';
  puVar1[0x99] = '\0';
  puVar1[0x9a] = '\0';
  puVar1[0x9b] = '\0';
  puVar1[0x9c] = '\0';
  puVar1[0x9d] = '\0';
  puVar1[0x9e] = '\0';
  puVar1[0x9f] = '\0';
  puVar1[0xa0] = 'w';
  puVar1[0xa1] = '\0';
  puVar1[0xa2] = '\0';
  puVar1[0xa3] = '\0';
  puVar1[0xa4] = 'x';
  puVar1[0xa5] = '\0';
  puVar1[0xa6] = '\0';
  puVar1[0xa7] = '\0';
  puVar1[0xa8] = '\0';
  puVar1[0xa9] = '\0';
  puVar1[0xaa] = '\0';
  puVar1[0xab] = '\0';
  puVar1[0xac] = '\0';
  puVar1[0xad] = '\0';
  puVar1[0xae] = '\0';
  puVar1[0xaf] = '\0';
  puVar1[0xb0] = 'y';
  puVar1[0xb1] = '\0';
  puVar1[0xb2] = '\0';
  puVar1[0xb3] = '\0';
  puVar1[0xb4] = '\0';
  puVar1[0xb5] = '\0';
  puVar1[0xb6] = '\0';
  puVar1[0xb7] = '\0';
  puVar1[0xc0] = '\0';
  puVar1[0xc1] = '\0';
  puVar1[0xc2] = 0xf4;
  puVar1[0xc3] = 'B';
  puVar1[0xc4] = '\0';
  puVar1[0xc5] = '\0';
  puVar1[0xc6] = 0xf6;
  puVar1[199] = 'B';
  puVar1[200] = '\0';
  puVar1[0xc9] = '\0';
  puVar1[0xca] = '\0';
  puVar1[0xcb] = '\0';
  puVar1[0xcc] = '\0';
  puVar1[0xcd] = '\0';
  puVar1[0xce] = '\0';
  puVar1[0xcf] = '\0';
  puVar1[0xd0] = '|';
  puVar1[0xd1] = '\0';
  puVar1[0xd2] = '\0';
  puVar1[0xd3] = '\0';
  puVar1[0xd4] = '}';
  puVar1[0xd5] = '\0';
  puVar1[0xd6] = '\0';
  puVar1[0xd7] = '\0';
  puVar1[0xd8] = '~';
  puVar1[0xd9] = '\0';
  puVar1[0xda] = '\0';
  puVar1[0xdb] = '\0';
  puVar1[0xdc] = '\0';
  puVar1[0xdd] = '\0';
  puVar1[0xde] = '\0';
  puVar1[0xdf] = '\0';
  puVar1[0xe0] = '\0';
  puVar1[0xe1] = '\0';
  puVar1[0xe2] = 0xfe;
  puVar1[0xe3] = 'B';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 2,0xc0);
  puVar1 = in_data[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = 0xe8;
  puVar1[1] = '\x03';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = 0xe9;
  puVar1[9] = '\x03';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = 0xea;
  puVar1[0xd] = '\x03';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = 0xeb;
  puVar1[0x11] = '\x03';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = 0xec;
  puVar1[0x15] = '\x03';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '@';
  puVar1[0x1a] = '{';
  puVar1[0x1b] = 'D';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = 0x80;
  puVar1[0x22] = '{';
  puVar1[0x23] = 'D';
  puVar1[0x24] = '\0';
  puVar1[0x25] = 0xc0;
  puVar1[0x26] = '{';
  puVar1[0x27] = 'D';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = '\0';
  puVar1[0x2b] = '\0';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = 0xf0;
  puVar1[0x31] = '\x03';
  puVar1[0x32] = '\0';
  puVar1[0x33] = '\0';
  puVar1[0x34] = 0xf1;
  puVar1[0x35] = '\x03';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = 0xf2;
  puVar1[0x39] = '\x03';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = '\0';
  puVar1[0x3f] = '\0';
  puVar1[0x40] = '\0';
  puVar1[0x41] = 0xc0;
  puVar1[0x42] = '|';
  puVar1[0x43] = 'D';
  puVar1[0x44] = '\0';
  puVar1[0x45] = '\0';
  puVar1[0x46] = '}';
  puVar1[0x47] = 'D';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = '\0';
  puVar1[0x4b] = '\0';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  puVar1[0x50] = 0xf5;
  puVar1[0x51] = '\x03';
  puVar1[0x52] = '\0';
  puVar1[0x53] = '\0';
  puVar1[0x54] = 0xf6;
  puVar1[0x55] = '\x03';
  puVar1[0x56] = '\0';
  puVar1[0x57] = '\0';
  puVar1[0x58] = 0xf7;
  puVar1[0x59] = '\x03';
  puVar1[0x5a] = '\0';
  puVar1[0x5b] = '\0';
  puVar1[0x5c] = '\0';
  puVar1[0x5d] = '\0';
  puVar1[0x5e] = '\0';
  puVar1[0x5f] = '\0';
  puVar1[0x60] = '\0';
  puVar1[0x61] = '\0';
  puVar1[0x62] = '~';
  puVar1[99] = 'D';
  puVar1[100] = '\0';
  puVar1[0x65] = '\0';
  puVar1[0x66] = '\0';
  puVar1[0x67] = '\0';
  puVar1[0x68] = '\0';
  puVar1[0x69] = '\0';
  puVar1[0x6a] = '\0';
  puVar1[0x6b] = '\0';
  puVar1[0x6c] = '\0';
  puVar1[0x6d] = '\0';
  puVar1[0x6e] = '\0';
  puVar1[0x6f] = '\0';
  puVar1[0x70] = 0xf9;
  puVar1[0x71] = '\x03';
  puVar1[0x72] = '\0';
  puVar1[0x73] = '\0';
  puVar1[0x74] = '\0';
  puVar1[0x75] = '\0';
  puVar1[0x76] = '\0';
  puVar1[0x77] = '\0';
  puVar1[0x78] = 0xfa;
  puVar1[0x79] = '\x03';
  puVar1[0x7a] = '\0';
  puVar1[0x7b] = '\0';
  puVar1[0x7c] = 0xfb;
  puVar1[0x7d] = '\x03';
  puVar1[0x7e] = '\0';
  puVar1[0x7f] = '\0';
  puVar1[0x80] = 0xfc;
  puVar1[0x81] = '\x03';
  puVar1[0x82] = '\0';
  puVar1[0x83] = '\0';
  puVar1[0x84] = '\0';
  puVar1[0x85] = '\0';
  puVar1[0x86] = '\0';
  puVar1[0x87] = '\0';
  puVar1[0x88] = '\0';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  puVar1[0x8c] = '\0';
  puVar1[0x8d] = '\0';
  puVar1[0x8e] = '\0';
  puVar1[0x8f] = '\0';
  puVar1[0x90] = '\0';
  puVar1[0x91] = '@';
  puVar1[0x92] = '\x7f';
  puVar1[0x93] = 'D';
  puVar1[0x94] = '\0';
  puVar1[0x95] = 0x80;
  puVar1[0x96] = '\x7f';
  puVar1[0x97] = 'D';
  puVar1[0x98] = '\0';
  puVar1[0x99] = '\0';
  puVar1[0x9a] = '\0';
  puVar1[0x9b] = '\0';
  puVar1[0x9c] = '\0';
  puVar1[0x9d] = '\0';
  puVar1[0x9e] = '\0';
  puVar1[0x9f] = '\0';
  puVar1[0xa0] = 0xff;
  puVar1[0xa1] = '\x03';
  puVar1[0xa2] = '\0';
  puVar1[0xa3] = '\0';
  puVar1[0xa4] = '\0';
  puVar1[0xa5] = '\x04';
  puVar1[0xa6] = '\0';
  puVar1[0xa7] = '\0';
  puVar1[0xa8] = '\x01';
  puVar1[0xa9] = '\x04';
  puVar1[0xaa] = '\0';
  puVar1[0xab] = '\0';
  puVar1[0xac] = '\0';
  puVar1[0xad] = '\0';
  puVar1[0xae] = '\0';
  puVar1[0xaf] = '\0';
  puVar1[0xb0] = '\0';
  puVar1[0xb1] = '@';
  puVar1[0xb2] = 0x80;
  puVar1[0xb3] = 'D';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 3,0xc0);
  puVar1 = in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = '\x10';
  puVar1[1] = '\'';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\x11';
  puVar1[9] = '\'';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\x12';
  puVar1[0xd] = '\'';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\x13';
  puVar1[0x11] = '\'';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\x14';
  puVar1[0x15] = '\'';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = 'T';
  puVar1[0x1a] = '\x1c';
  puVar1[0x1b] = 'F';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = 'X';
  puVar1[0x22] = '\x1c';
  puVar1[0x23] = 'F';
  puVar1[0x24] = '\0';
  puVar1[0x25] = '\\';
  puVar1[0x26] = '\x1c';
  puVar1[0x27] = 'F';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = '\0';
  puVar1[0x2b] = '\0';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = '\x18';
  puVar1[0x31] = '\'';
  puVar1[0x32] = '\0';
  puVar1[0x33] = '\0';
  puVar1[0x34] = '\x19';
  puVar1[0x35] = '\'';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = '\x1a';
  puVar1[0x39] = '\'';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = '\0';
  puVar1[0x3f] = '\0';
  puVar1[0x40] = '\0';
  puVar1[0x41] = 'l';
  puVar1[0x42] = '\x1c';
  puVar1[0x43] = 'F';
  puVar1[0x44] = '\0';
  puVar1[0x45] = 'p';
  puVar1[0x46] = '\x1c';
  puVar1[0x47] = 'F';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = '\0';
  puVar1[0x4b] = '\0';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  puVar1[0x50] = '\x1d';
  puVar1[0x51] = '\'';
  puVar1[0x52] = '\0';
  puVar1[0x53] = '\0';
  puVar1[0x54] = '\x1e';
  puVar1[0x55] = '\'';
  puVar1[0x56] = '\0';
  puVar1[0x57] = '\0';
  puVar1[0x58] = '\x1f';
  puVar1[0x59] = '\'';
  puVar1[0x5a] = '\0';
  puVar1[0x5b] = '\0';
  puVar1[0x5c] = '\0';
  puVar1[0x5d] = '\0';
  puVar1[0x5e] = '\0';
  puVar1[0x5f] = '\0';
  puVar1[0x60] = '\0';
  puVar1[0x61] = 0x80;
  puVar1[0x62] = '\x1c';
  puVar1[99] = 'F';
  puVar1[100] = '\0';
  puVar1[0x65] = '\0';
  puVar1[0x66] = '\0';
  puVar1[0x67] = '\0';
  puVar1[0x68] = '\0';
  puVar1[0x69] = '\0';
  puVar1[0x6a] = '\0';
  puVar1[0x6b] = '\0';
  puVar1[0x6c] = '\0';
  puVar1[0x6d] = '\0';
  puVar1[0x6e] = '\0';
  puVar1[0x6f] = '\0';
  puVar1[0x70] = '!';
  puVar1[0x71] = '\'';
  puVar1[0x72] = '\0';
  puVar1[0x73] = '\0';
  puVar1[0x74] = '\0';
  puVar1[0x75] = '\0';
  puVar1[0x76] = '\0';
  puVar1[0x77] = '\0';
  puVar1[0x78] = '\"';
  puVar1[0x79] = '\'';
  puVar1[0x7a] = '\0';
  puVar1[0x7b] = '\0';
  puVar1[0x7c] = '#';
  puVar1[0x7d] = '\'';
  puVar1[0x7e] = '\0';
  puVar1[0x7f] = '\0';
  puVar1[0x80] = '$';
  puVar1[0x81] = '\'';
  puVar1[0x82] = '\0';
  puVar1[0x83] = '\0';
  puVar1[0x84] = '\0';
  puVar1[0x85] = '\0';
  puVar1[0x86] = '\0';
  puVar1[0x87] = '\0';
  puVar1[0x88] = '\0';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  puVar1[0x8c] = '\0';
  puVar1[0x8d] = '\0';
  puVar1[0x8e] = '\0';
  puVar1[0x8f] = '\0';
  puVar1[0x90] = '\0';
  puVar1[0x91] = 0x94;
  puVar1[0x92] = '\x1c';
  puVar1[0x93] = 'F';
  puVar1[0x94] = '\0';
  puVar1[0x95] = 0x98;
  puVar1[0x96] = '\x1c';
  puVar1[0x97] = 'F';
  puVar1[0x98] = '\0';
  puVar1[0x99] = '\0';
  puVar1[0x9a] = '\0';
  puVar1[0x9b] = '\0';
  puVar1[0x9c] = '\0';
  puVar1[0x9d] = '\0';
  puVar1[0x9e] = '\0';
  puVar1[0x9f] = '\0';
  puVar1[0xa0] = '\'';
  puVar1[0xa1] = '\'';
  puVar1[0xa2] = '\0';
  puVar1[0xa3] = '\0';
  puVar1[0xa4] = '(';
  puVar1[0xa5] = '\'';
  puVar1[0xa6] = '\0';
  puVar1[0xa7] = '\0';
  puVar1[0xa8] = ')';
  puVar1[0xa9] = '\'';
  puVar1[0xaa] = '\0';
  puVar1[0xab] = '\0';
  puVar1[0xac] = '\0';
  puVar1[0xad] = '\0';
  puVar1[0xae] = '\0';
  puVar1[0xaf] = '\0';
  puVar1[0xb0] = '\0';
  puVar1[0xb1] = 0xa8;
  puVar1[0xb2] = '\x1c';
  puVar1[0xb3] = 'F';
  return (char *)puVar1;
}

Assistant:

const char* GetInputC4(std::vector<GLubyte> in_data[4])
{
	/* input 0, std140 */
	{
		in_data[0].resize(60 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[0][0]);
		int*   ip = reinterpret_cast<int*>(&in_data[0][0]);
		ip[0]	 = 1;
		ip[1]	 = 0;
		ip[2]	 = 0;
		ip[3]	 = 0;
		ip[4]	 = 2;
		ip[5]	 = 3;
		ip[6]	 = 0;
		ip[7]	 = 0;
		ip[8]	 = 4;
		ip[9]	 = 5;
		ip[10]	= 0;
		ip[11]	= 0;
		fp[12]	= 6.0f;
		fp[13]	= 0.0f;
		fp[14]	= 0.0f;
		fp[15]	= 0.0f;
		fp[16]	= 7.0f;
		fp[17]	= 8.0f;
		fp[18]	= 0.0f;
		fp[19]	= 0.0f;
		ip[20]	= 9;
		ip[21]	= 10;
		ip[22]	= 11;
		ip[23]	= 0;
		fp[24]	= 12.0f;
		fp[25]	= 13.0f;
		fp[26]	= 0.0f;
		fp[27]	= 0.0f;
		ip[28]	= 14;
		ip[29]	= 15;
		ip[30]	= 16;
		ip[31]	= 0;
		fp[32]	= 17.0f;
		fp[33]	= 0.0f;
		fp[34]	= 0.0f;
		fp[35]	= 0.0f;
		ip[36]	= 18;
		ip[37]	= 0;
		ip[38]	= 0;
		ip[39]	= 0;
		ip[40]	= 19;
		ip[41]	= 20;
		ip[42]	= 0;
		ip[43]	= 0;
		ip[44]	= 21;
		ip[45]	= 0;
		ip[45]	= 0;
		ip[45]	= 0;
		fp[48]	= 22.0f;
		fp[49]	= 23.0f;
		fp[50]	= 0.0f;
		fp[51]	= 0.0f;
		ip[52]	= 24;
		ip[53]	= 25;
		ip[54]	= 26;
		ip[55]	= 0;
		fp[56]	= 27.0f;
	}
	/* input 1, std140 */
	{
		in_data[1].resize(60 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[1][0]);
		int*   ip = reinterpret_cast<int*>(&in_data[1][0]);
		ip[0]	 = 101;
		ip[1]	 = 0;
		ip[2]	 = 0;
		ip[3]	 = 0;
		ip[4]	 = 102;
		ip[5]	 = 103;
		ip[6]	 = 0;
		ip[7]	 = 0;
		ip[8]	 = 104;
		ip[9]	 = 105;
		ip[10]	= 0;
		ip[11]	= 0;
		fp[12]	= 106.0f;
		fp[13]	= 0.0f;
		fp[14]	= 0.0f;
		fp[15]	= 0.0f;
		fp[16]	= 107.0f;
		fp[17]	= 108.0f;
		fp[18]	= 0.0f;
		fp[19]	= 0.0f;
		ip[20]	= 109;
		ip[21]	= 110;
		ip[22]	= 111;
		ip[23]	= 0;
		fp[24]	= 112.0f;
		fp[25]	= 113.0f;
		fp[26]	= 0.0f;
		fp[27]	= 0.0f;
		ip[28]	= 114;
		ip[29]	= 115;
		ip[30]	= 116;
		ip[31]	= 0;
		fp[32]	= 117.0f;
		fp[33]	= 0.0f;
		fp[34]	= 0.0f;
		fp[35]	= 0.0f;
		ip[36]	= 118;
		ip[37]	= 0;
		ip[38]	= 0;
		ip[39]	= 0;
		ip[40]	= 119;
		ip[41]	= 120;
		ip[42]	= 0;
		ip[43]	= 0;
		ip[44]	= 121;
		ip[45]	= 0;
		ip[45]	= 0;
		ip[45]	= 0;
		fp[48]	= 122.0f;
		fp[49]	= 123.0f;
		fp[50]	= 0.0f;
		fp[51]	= 0.0f;
		ip[52]	= 124;
		ip[53]	= 125;
		ip[54]	= 126;
		ip[55]	= 0;
		fp[56]	= 127.0f;
	}
	/* input 2, std430 */
	{
		in_data[2].resize(48 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[2][0]);
		int*   ip = reinterpret_cast<int*>(&in_data[2][0]);
		ip[0]	 = 1000;
		ip[1]	 = 0;
		ip[2]	 = 1001;
		ip[3]	 = 1002;
		ip[4]	 = 1003;
		ip[5]	 = 1004;
		fp[6]	 = 1005.0f;
		fp[7]	 = 0.0f;
		fp[8]	 = 1006.0f;
		fp[9]	 = 1007.0f;
		fp[10]	= 0.0f;
		fp[11]	= 0.0f;
		ip[12]	= 1008;
		ip[13]	= 1009;
		ip[14]	= 1010;
		ip[15]	= 0;
		fp[16]	= 1011.0f;
		fp[17]	= 1012.0f;
		fp[18]	= 0.0f;
		fp[19]	= 0.0f;
		ip[20]	= 1013;
		ip[21]	= 1014;
		ip[22]	= 1015;
		ip[23]	= 0;
		fp[24]	= 1016.0f;
		fp[25]	= 0.0f;
		fp[26]	= 0.0f;
		fp[27]	= 0.0f;
		ip[28]	= 1017;
		ip[29]	= 0;
		ip[30]	= 1018;
		ip[31]	= 1019;
		ip[32]	= 1020;
		ip[33]	= 0;
		ip[34]	= 0;
		ip[35]	= 0;
		fp[36]	= 1021.0f;
		fp[37]	= 1022.0f;
		fp[38]	= 0.0f;
		fp[39]	= 0.0f;
		ip[40]	= 1023;
		ip[41]	= 1024;
		ip[42]	= 1025;
		ip[43]	= 0;
		fp[44]	= 1026.0f;
	}
	/* input 3, std430 */
	{
		in_data[3].resize(48 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[3][0]);
		int*   ip = reinterpret_cast<int*>(&in_data[3][0]);
		ip[0]	 = 10000;
		ip[1]	 = 0;
		ip[2]	 = 10001;
		ip[3]	 = 10002;
		ip[4]	 = 10003;
		ip[5]	 = 10004;
		fp[6]	 = 10005.0f;
		fp[7]	 = 0.0f;
		fp[8]	 = 10006.0f;
		fp[9]	 = 10007.0f;
		fp[10]	= 0.0f;
		fp[11]	= 0.0f;
		ip[12]	= 10008;
		ip[13]	= 10009;
		ip[14]	= 10010;
		ip[15]	= 0;
		fp[16]	= 10011.0f;
		fp[17]	= 10012.0f;
		fp[18]	= 0.0f;
		fp[19]	= 0.0f;
		ip[20]	= 10013;
		ip[21]	= 10014;
		ip[22]	= 10015;
		ip[23]	= 0;
		fp[24]	= 10016.0f;
		fp[25]	= 0.0f;
		fp[26]	= 0.0f;
		fp[27]	= 0.0f;
		ip[28]	= 10017;
		ip[29]	= 0;
		ip[30]	= 10018;
		ip[31]	= 10019;
		ip[32]	= 10020;
		ip[33]	= 0;
		ip[34]	= 0;
		ip[35]	= 0;
		fp[36]	= 10021.0f;
		fp[37]	= 10022.0f;
		fp[38]	= 0.0f;
		fp[39]	= 0.0f;
		ip[40]	= 10023;
		ip[41]	= 10024;
		ip[42]	= 10025;
		ip[43]	= 0;
		fp[44]	= 10026.0f;
	}
	return NL
		"struct Struct0 {" NL "  ivec2 data0;" NL "};" NL "struct Struct1 {" NL "  vec2 data0;" NL "  ivec3 data1;" NL
		"};" NL "struct Struct2 {" NL "  int data0;" NL "  Struct0 data1;" NL "  int data2;" NL "  Struct1 data3;" NL
		"  float data4;" NL "};" NL "layout(std140, binding = 0) buffer Input01 {" NL "  int data0;" NL
		"  Struct0 data1[2];" NL "  float data2;" NL "  Struct1 data3[2];" NL "  float data4;" NL "  Struct2 data5;" NL
		"} g_input01[2];" NL "layout(std430, binding = 2) buffer Input23 {" NL "  int data0;" NL
		"  Struct0 data1[2];" NL "  float data2;" NL "  Struct1 data3[2];" NL "  float data4;" NL "  Struct2 data5;" NL
		"} g_input23[2];"

		NL "layout(std140, binding = 4) buffer Output01 {" NL "  int data0;" NL "  Struct0 data1[2];" NL
		"  float data2;" NL "  Struct1 data3[2];" NL "  float data4;" NL "  Struct2 data5;" NL "} g_output01[2];" NL
		"layout(std430, binding = 6) buffer Output23 {" NL "  int data0;" NL "  Struct0 data1[2];" NL
		"  float data2;" NL "  Struct1 data3[2];" NL "  float data4;" NL "  Struct2 data5;" NL "} g_output23[2];" NL NL
		"void main() {" NL "  for (int b = 0; b < g_input01.length(); ++b) {" NL
		"    g_output01[b].data0 = g_input01[b].data0;" NL
		"    for (int i = 0; i < g_input01[b].data1.length(); ++i) g_output01[b].data1[i] = g_input01[b].data1[i];" NL
		"    g_output01[b].data2 = g_input01[b].data2;" NL "    g_output01[b].data3[0] = g_input01[b].data3[0];" NL
		"    g_output01[b].data3[1] = g_input01[b].data3[1];" NL "    g_output01[b].data4 = g_input01[b].data4;" NL
		"  }" NL "  g_output01[0].data5 = g_input01[0].data5;" NL "  g_output01[1].data5 = g_input01[1].data5;" NL NL
		"  for (int b = 0; b < g_input23.length(); ++b) {" NL "    g_output23[b].data0 = g_input23[b].data0;" NL
		"    for (int i = 0; i < g_input23[b].data1.length(); ++i) g_output23[b].data1[i] = g_input23[b].data1[i];" NL
		"    g_output23[b].data2 = g_input23[b].data2;" NL "    g_output23[b].data3[0] = g_input23[b].data3[0];" NL
		"    g_output23[b].data3[1] = g_input23[b].data3[1];" NL "    g_output23[b].data4 = g_input23[b].data4;" NL
		"  }" NL "  g_output23[0].data5 = g_input23[0].data5;" NL "  g_output23[1].data5 = g_input23[1].data5;" NL "}";
}